

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::emplace_back<>
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this)

{
  pointer pSVar1;
  size_type sVar2;
  ulong uVar3;
  SmallVector<int,_10UL> *pSVar4;
  long *plVar5;
  size_type sVar6;
  Base *ctx;
  Base *other;
  Base *other_00;
  SmallVector<int,_10UL> *pSVar7;
  long lVar8;
  Base *pBVar9;
  
  pSVar1 = this->data_;
  sVar2 = this->len;
  other = &pSVar1[sVar2].super_SmallVectorBase<int>;
  if (sVar2 != this->cap) {
    other->data_ = (pointer)other->firstElement;
    other->len = 0;
    other->cap = 10;
    this->len = sVar2 + 1;
    return pSVar1 + sVar2;
  }
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  pBVar9 = (Base *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (Base *)(uVar3 * 2);
  if (pBVar9 < ctx) {
    pBVar9 = ctx;
  }
  if (0x1ffffffffffffff - uVar3 < uVar3) {
    pBVar9 = (Base *)0x1ffffffffffffff;
  }
  lVar8 = (long)other - (long)this->data_;
  pSVar4 = (SmallVector<int,_10UL> *)operator_new((long)pBVar9 << 6);
  plVar5 = (long *)((long)pSVar4 + lVar8);
  *plVar5 = (long)(plVar5 + 3);
  plVar5[1] = 0;
  plVar5[2] = 10;
  other_00 = &this->data_->super_SmallVectorBase<int>;
  sVar2 = this->len;
  sVar6 = sVar2 * 0x40;
  pSVar7 = pSVar4;
  if (other_00 + sVar2 * 2 == other) {
    while (sVar2 != 0) {
      ctx = other_00;
      SmallVector<int,_10UL>::SmallVector(pSVar7,other_00);
      other_00 = other_00 + 2;
      sVar6 = sVar6 - 0x40;
      pSVar7 = pSVar7 + 1;
      sVar2 = sVar6;
    }
  }
  else {
    for (; other_00 != other; other_00 = other_00 + 2) {
      ctx = other_00;
      SmallVector<int,_10UL>::SmallVector(pSVar7,other_00);
      pSVar7 = pSVar7 + 1;
    }
    sVar2 = this->len;
    pSVar1 = this->data_;
    if (&pSVar1[sVar2].super_SmallVectorBase<int> != other) {
      pSVar7 = (SmallVector<int,_10UL> *)(lVar8 + (long)pSVar4);
      do {
        pSVar7 = pSVar7 + 1;
        ctx = other;
        SmallVector<int,_10UL>::SmallVector(pSVar7,other);
        other = other + 2;
      } while (other != &pSVar1[sVar2].super_SmallVectorBase<int>);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pBVar9;
  this->data_ = pSVar4;
  return (reference)((long)pSVar4 + lVar8);
}

Assistant:

[[nodiscard]] constexpr iterator end() noexcept { return data_ + len; }